

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR NpyArray::LoadNPZ(string *filename,npz_t *arrays)

{
  char *pcVar1;
  FILE *fp;
  string varname;
  NpyArray arr;
  ScopeExitRun closeFp;
  FILE *local_d0;
  string local_c8;
  NpyArray local_a8;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  function<void_()> local_48;
  
  local_d0 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_d0 == (FILE *)0x0) {
    pcVar1 = "error: unable to open file";
  }
  else {
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = &local_d0;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:218:29)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:218:29)>
               ::_M_manager;
    std::function<void_()>::function(&local_48,(function<void_()> *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    while( true ) {
      local_a8.numValues = 0;
      local_a8.wordSize = 0;
      local_a8.type = '\0';
      local_a8.fortranOrder = false;
      local_c8._M_string_length = 0;
      local_a8.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.data = (uint8_t *)0x0;
      local_a8.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar1 = LoadArrayNPZ((FILE *)local_d0,&local_c8,&local_a8);
      if (pcVar1 != (LPCSTR)0x0) break;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NpyArray>,std::_Select1st<std::pair<std::__cxx11::string_const,NpyArray>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>
      ::_M_emplace_unique<std::__cxx11::string&,NpyArray>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NpyArray>,std::_Select1st<std::pair<std::__cxx11::string_const,NpyArray>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NpyArray>>>
                  *)arrays,&local_c8,&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      ~NpyArray(&local_a8);
    }
    if (pcVar1 == (LPCSTR)0x1) {
      std::__cxx11::string::~string((string *)&local_c8);
      ~NpyArray(&local_a8);
      pcVar1 = (LPCSTR)0x0;
    }
    else {
      std::__cxx11::string::~string((string *)&local_c8);
      ~NpyArray(&local_a8);
    }
    TScopeExitRun<std::function<void_()>_>::~TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)&local_48);
  }
  return pcVar1;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(std::string filename, npz_t& arrays)
{
	FILE* fp = fopen(filename.c_str(), "rb");
	if (!fp)
		return "error: unable to open file";
	const ScopeExitRun closeFp([&]() { fclose(fp); });
	while (true) {
		NpyArray arr;
		std::string varname;
		const LPCSTR ret = LoadArrayNPZ(fp, varname, arr);
		if (ret == (const char*)1)
			break;
		if (ret != NULL)
			return ret;
		arrays.emplace(varname, std::move(arr));
	}
	return NULL;
}